

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

bool __thiscall cppcms::application::owns_context(application *this)

{
  application *paVar1;
  application *paVar2;
  
  paVar2 = this->root_;
  paVar1 = paVar2->root_;
  if (paVar2 != paVar2->root_) {
    do {
      paVar2 = paVar1;
      this->root_ = paVar2;
      paVar1 = paVar2->root_;
    } while (paVar2->root_ != paVar2);
  }
  return (((paVar2->d).ptr_)->conn).
         super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
         (element_type *)0x0;
}

Assistant:

application *application::root()
{
	if(root_ == root_->root_)
		return root_;
	do {
		root_ = root_->root_;
	}
	while(root_->root_ != root_);
	return root_;
}